

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dutils.cc
# Opt level: O3

void print_group_info(GroupInfo *group_info)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  long *plVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Group: ",7);
  pcVar1 = group_info->name;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x111128);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
  *(uint *)(strcmp + *(long *)(std::cout + -0x18)) =
       *(uint *)(strcmp + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)group_info->name_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"ID ",3);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)group_info->id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  pcVar1 = group_info->description;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)group_info->descr_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"next: ",6);
  plVar4 = (long *)std::ostream::operator<<(poVar3,group_info->next_offset);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  return;
}

Assistant:

void print_group_info (const GroupInfo &group_info) {
	cout << "Group: " << group_info.name 
		<< "(" << dec << static_cast<int>(group_info.name_length) << ") "
		<< "ID " << static_cast<int>(group_info.id) << ": "
		<< group_info.description
		<< "(" << static_cast<int>(group_info.descr_length) <<") "
		<< "next: " << group_info.next_offset << endl;
}